

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O3

void free_displaychars(void)

{
  nh_bool nVar1;
  wchar_t fd;
  size_t sVar2;
  fnchar filename [256];
  char local_108 [5];
  undefined8 auStack_103 [31];
  
  local_108[0] = '\0';
  nVar1 = get_gamedir(CONFIG_DIR,local_108);
  if (nVar1 != '\0') {
    sVar2 = strlen(local_108);
    builtin_strncpy(local_108 + sVar2,"unicode.",8);
    *(undefined8 *)((long)auStack_103 + sVar2) = 0x666e6f632e6564;
    fd = open(local_108,0x242,0x1a4);
    if (fd != L'\xffffffff') {
      fchmod(fd,0x1a4);
      write(fd,
            "# Unicode symbol configuration for DynaHack\n# Lines that begin with \'#\' are commented out.\n# Change the \'#\' to an \'!\' to activate a line.\n"
            ,0x8a);
      write_symlist(fd,unicode_drawing->bgelements,unicode_drawing->num_bgelements);
      write_symlist(fd,unicode_drawing->traps,unicode_drawing->num_traps);
      write_symlist(fd,unicode_drawing->objects,unicode_drawing->num_objects);
      write_symlist(fd,unicode_drawing->monsters,unicode_drawing->num_monsters);
      write_symlist(fd,unicode_drawing->warnings,unicode_drawing->num_warnings);
      write_symlist(fd,unicode_drawing->invis,L'\x01');
      write_symlist(fd,unicode_drawing->effects,unicode_drawing->num_effects);
      write_symlist(fd,unicode_drawing->expltypes,unicode_drawing->num_expltypes);
      write_symlist(fd,unicode_drawing->explsyms,L'\t');
      write_symlist(fd,unicode_drawing->zaptypes,unicode_drawing->num_zaptypes);
      write_symlist(fd,unicode_drawing->zapsyms,L'\x04');
      write_symlist(fd,unicode_drawing->breathsyms,L'\x04');
      write_symlist(fd,unicode_drawing->swallowsyms,L'\b');
      close(fd);
    }
  }
  free_drawing_info(default_drawing);
  free_drawing_info(unicode_drawing);
  free_drawing_info(rogue_drawing);
  rogue_drawing = (curses_drawing_info *)0x0;
  default_drawing = (curses_drawing_info *)0x0;
  return;
}

Assistant:

void free_displaychars(void)
{
    write_unisym_config();
    
    free_drawing_info(default_drawing);
    free_drawing_info(unicode_drawing);
    free_drawing_info(rogue_drawing);
    
    default_drawing = rogue_drawing = NULL;
}